

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::BlockMapPrepareLongKeyValue(Emitter *this,value child)

{
  bool bVar1;
  pointer pEVar2;
  size_t n_;
  int in_ESI;
  long in_RDI;
  size_t curIndent;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ostream_wrapper *in_stack_ffffffffffffffd0;
  IndentTo in_stack_ffffffffffffffe0;
  undefined1 requireSpace;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                     ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                      0xef8d1c);
  n_ = EmitterState::CurIndent(pEVar2);
  if (in_ESI == 0) {
    return;
  }
  pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                     ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                      0xef8d3f);
  bVar1 = EmitterState::HasBegunContent(pEVar2);
  if (!bVar1) {
    YAML::operator<<(in_stack_ffffffffffffffd0,
                     (char (*) [2])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffd0 = (ostream_wrapper *)(in_RDI + 8);
    IndentTo::IndentTo((IndentTo *)&stack0xffffffffffffffe0,n_);
    YAML::operator<<(in_stack_ffffffffffffffd0,
                     (IndentTo *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    YAML::operator<<(in_stack_ffffffffffffffd0,
                     (char (*) [2])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  requireSpace = (undefined1)(n_ >> 0x38);
  if (in_ESI == 0) {
    return;
  }
  if (in_ESI - 1U < 3) {
LAB_00ef8ddf:
    SpaceOrIndentTo((Emitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(bool)requireSpace,
                    in_stack_ffffffffffffffe0.n);
  }
  else {
    if (in_ESI != 4) {
      if (in_ESI == 5) goto LAB_00ef8ddf;
      if (in_ESI != 6) {
        return;
      }
    }
    iVar3 = in_ESI;
    pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef8e03);
    bVar1 = EmitterState::HasBegunContent(pEVar2);
    if (bVar1) {
      YAML::operator<<(in_stack_ffffffffffffffd0,
                       (char (*) [2])CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
    }
    SpaceOrIndentTo((Emitter *)CONCAT44(iVar3,in_stack_fffffffffffffff0),(bool)requireSpace,
                    in_stack_ffffffffffffffe0.n);
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareLongKeyValue(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunContent()) {
    m_stream << "\n";
    m_stream << IndentTo(curIndent);
    m_stream << ":";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(true, curIndent + 1);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunContent())
        m_stream << "\n";
      SpaceOrIndentTo(true, curIndent + 1);
      break;
  }
}